

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O0

void __thiscall
bssl::InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>,2ul>::
EraseIf<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0>
          (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>,2ul> *this,
          anon_class_8_1_ba1d796c_for__M_pred pred)

{
  bool bVar1;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *puVar2;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *puVar3;
  size_t sVar4;
  ulong local_38;
  size_t i;
  size_t new_size;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *iter;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this_local;
  anon_class_8_1_ba1d796c_for__M_pred pred_local;
  
  this_local = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *
               )pred.ssl;
  puVar2 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::begin
                     ((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                       *)this);
  puVar3 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::end
                     ((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                       *)this);
  puVar2 = std::
           find_if<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>*,bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0>
                     (puVar2,puVar3,(anon_class_8_1_ba1d796c_for__M_pred)this_local);
  puVar3 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::end
                     ((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                       *)this);
  if (puVar2 != puVar3) {
    puVar3 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
             begin((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                    *)this);
    i = (long)puVar2 - (long)puVar3 >> 3;
    local_38 = i;
    while( true ) {
      local_38 = local_38 + 1;
      sVar4 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
              size((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                    *)this);
      if (sVar4 <= local_38) break;
      puVar2 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
               operator[]((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                           *)this,local_38);
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
              ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                        ((anon_class_8_1_ba1d796c_for__M_pred *)&this_local,puVar2);
      if (!bVar1) {
        puVar2 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                 ::operator[]((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                               *)this,local_38);
        puVar3 = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                 ::operator[]((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                               *)this,i);
        std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::operator=(puVar3,puVar2);
        i = i + 1;
      }
    }
    InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::Shrink
              ((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *
               )this,i);
  }
  return;
}

Assistant:

void EraseIf(Pred pred) {
    // See if anything needs to be erased at all. This avoids a self-move.
    auto iter = std::find_if(begin(), end(), pred);
    if (iter == end()) {
      return;
    }

    // Elements before the first to be erased may be left as-is.
    size_t new_size = iter - begin();
    // Swap all subsequent elements in if they are to be kept.
    for (size_t i = new_size + 1; i < size(); i++) {
      if (!pred((*this)[i])) {
        (*this)[new_size] = std::move((*this)[i]);
        new_size++;
      }
    }

    Shrink(new_size);
  }